

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::preprocessChildren(TraverseSchema *this,DOMElement *root)

{
  short sVar1;
  short sVar2;
  SchemaInfo *pSVar3;
  int iVar4;
  DOMNode *node;
  undefined4 extraout_var;
  short *psVar6;
  short *psVar7;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_40;
  short *psVar5;
  
  pSVar3 = this->fSchemaInfo;
  if (root == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,root);
  }
  local_40.fSchemaInfo = pSVar3;
  for (node = &XUtil::getFirstChildElement(&root->super_DOMNode)->super_DOMNode;
      node != (DOMNode *)0x0; node = &XUtil::getNextSiblingElement(node)->super_DOMNode) {
    iVar4 = (*node->_vptr_DOMNode[0x18])(node);
    psVar5 = (short *)CONCAT44(extraout_var,iVar4);
    if (psVar5 != &SchemaSymbols::fgELT_ANNOTATION) {
      psVar6 = &SchemaSymbols::fgELT_ANNOTATION;
      if (psVar5 == (short *)0x0) {
LAB_00327133:
        if (*psVar6 == 0) goto LAB_003271f8;
      }
      else {
        psVar6 = &SchemaSymbols::fgELT_ANNOTATION;
        psVar7 = psVar5;
        do {
          sVar1 = *psVar7;
          if (sVar1 == 0) goto LAB_00327133;
          psVar7 = psVar7 + 1;
          sVar2 = *psVar6;
          psVar6 = psVar6 + 1;
        } while (sVar1 == sVar2);
      }
      if (psVar5 == &SchemaSymbols::fgELT_INCLUDE) {
LAB_0032719d:
        preprocessInclude(this,(DOMElement *)node);
      }
      else {
        psVar6 = &SchemaSymbols::fgELT_INCLUDE;
        if (psVar5 == (short *)0x0) {
LAB_0032716a:
          if (*psVar6 == 0) goto LAB_0032719d;
        }
        else {
          psVar6 = &SchemaSymbols::fgELT_INCLUDE;
          psVar7 = psVar5;
          do {
            sVar1 = *psVar7;
            if (sVar1 == 0) goto LAB_0032716a;
            psVar7 = psVar7 + 1;
            sVar2 = *psVar6;
            psVar6 = psVar6 + 1;
          } while (sVar1 == sVar2);
        }
        if (psVar5 == &SchemaSymbols::fgELT_IMPORT) {
LAB_003271da:
          preprocessImport(this,(DOMElement *)node);
        }
        else {
          psVar6 = &SchemaSymbols::fgELT_IMPORT;
          if (psVar5 == (short *)0x0) {
LAB_003271aa:
            if (*psVar6 == 0) goto LAB_003271da;
          }
          else {
            psVar6 = &SchemaSymbols::fgELT_IMPORT;
            psVar7 = psVar5;
            do {
              sVar1 = *psVar7;
              if (sVar1 == 0) goto LAB_003271aa;
              psVar7 = psVar7 + 1;
              sVar2 = *psVar6;
              psVar6 = psVar6 + 1;
            } while (sVar1 == sVar2);
          }
          if (psVar5 != &SchemaSymbols::fgELT_REDEFINE) {
            psVar6 = &SchemaSymbols::fgELT_REDEFINE;
            if (psVar5 != (short *)0x0) {
              psVar6 = &SchemaSymbols::fgELT_REDEFINE;
              while (sVar1 = *psVar5, sVar1 != 0) {
                psVar5 = psVar5 + 1;
                sVar2 = *psVar6;
                psVar6 = psVar6 + 1;
                if (sVar1 != sVar2) goto LAB_00327208;
              }
            }
            if (*psVar6 != 0) break;
          }
          preprocessRedefine(this,(DOMElement *)node);
        }
      }
    }
LAB_003271f8:
  }
LAB_00327208:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return;
}

Assistant:

void TraverseSchema::preprocessChildren(const DOMElement* const root) {

    NamespaceScopeManager nsMgr(root, fSchemaInfo, this);

    // process <redefine>, <include> and <import> info items.
    DOMElement* child = XUtil::getFirstChildElement(root);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* name = child->getLocalName();

        if (XMLString::equals(name, SchemaSymbols::fgELT_ANNOTATION)) {
            continue;
        }
        else if (XMLString::equals(name, SchemaSymbols::fgELT_INCLUDE)) {
            preprocessInclude(child);
        }
        else if (XMLString::equals(name, SchemaSymbols::fgELT_IMPORT)) {
            preprocessImport(child);
        }
        else if (XMLString::equals(name, SchemaSymbols::fgELT_REDEFINE)) {
            preprocessRedefine(child);
        }
        else
            break;
    }
}